

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONMemory.h
# Opt level: O3

JSONNode ** json_malloc<JSONNode*>(size_t count)

{
  JSONNode **ppJVar1;
  json_string local_38;
  
  ppJVar1 = (JSONNode **)malloc(count << 3);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Out of memory","");
  JSONDebug::_JSON_ASSERT(ppJVar1 != (JSONNode **)0x0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return ppJVar1;
}

Assistant:

static inline T * json_malloc(size_t count) json_nothrow {
	   #ifdef JSON_DEBUG  //in debug mode, see if the malloc was successful
		  void * result = std::malloc(count * sizeof(T));
		  JSON_ASSERT(result != 0, JSON_TEXT("Out of memory"));
		  #ifdef JSON_NULL_MEMORY
			 std::memset(result, '\0', count  * sizeof(T));
		  #endif
		  return (T *)result;
	   #else
		  return (T *)std::malloc(count * sizeof(T));
	   #endif
    }